

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O1

_Bool ts_stack_merge(Stack *self,StackVersion version1,StackVersion version2)

{
  StackHead *pSVar1;
  StackHead *pSVar2;
  StackLink link;
  _Bool _Var3;
  StackNode *pSVar4;
  ulong uVar5;
  long lVar6;
  
  _Var3 = ts_stack_can_merge(self,version1,version2);
  if (_Var3) {
    pSVar2 = (self->heads).contents;
    pSVar1 = pSVar2 + version1;
    pSVar4 = pSVar2[version2].node;
    if (pSVar4->link_count != 0) {
      lVar6 = 0x10;
      uVar5 = 0;
      do {
        link._16_8_ = *(undefined8 *)((long)&pSVar4->links[0].node + lVar6);
        link._0_16_ = *(undefined1 (*) [16])((long)pSVar4->links + lVar6 + -0x10);
        stack_node_add_link(pSVar1->node,link,self->subtree_pool);
        uVar5 = uVar5 + 1;
        pSVar4 = pSVar2[version2].node;
        lVar6 = lVar6 + 0x18;
      } while (uVar5 < pSVar4->link_count);
    }
    if (pSVar1->node->state == 0) {
      pSVar1->node_count_at_last_error = pSVar1->node->node_count;
    }
    ts_stack_remove_version(self,version2);
  }
  return _Var3;
}

Assistant:

bool ts_stack_merge(Stack *self, StackVersion version1, StackVersion version2) {
  if (!ts_stack_can_merge(self, version1, version2)) return false;
  StackHead *head1 = &self->heads.contents[version1];
  StackHead *head2 = &self->heads.contents[version2];
  for (uint32_t i = 0; i < head2->node->link_count; i++) {
    stack_node_add_link(head1->node, head2->node->links[i], self->subtree_pool);
  }
  if (head1->node->state == ERROR_STATE) {
    head1->node_count_at_last_error = head1->node->node_count;
  }
  ts_stack_remove_version(self, version2);
  return true;
}